

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<signed_char,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCast>>
               (char *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  undefined8 uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char **ppcVar11;
  ulong uVar12;
  ulong uVar13;
  unsigned_long uVar14;
  string_t sVar15;
  Vector *result;
  char **local_78;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &(result_data->value).pointer.ptr;
      iVar7 = 0;
      do {
        sVar15 = StringCast::Operation<signed_char>(ldata[iVar7],(Vector *)dataptr);
        uVar6 = sVar15.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_78 + -1);
        paVar1->length = (int)uVar6;
        paVar1->prefix[0] = (char)((ulong)uVar6 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar6 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar6 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar6 >> 0x38);
        *local_78 = sVar15.value._8_8_;
        iVar7 = iVar7 + 1;
        local_78 = local_78 + 2;
      } while (count != iVar7);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var4 = p_Stack_40;
      peVar3 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      uVar9 = 0;
      uVar13 = 0;
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar14 = 0xffffffffffffffff;
        }
        else {
          uVar14 = puVar2[uVar9];
        }
        uVar8 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar8 = count;
        }
        uVar12 = uVar8;
        if (uVar14 != 0) {
          uVar12 = uVar13;
          if (uVar14 == 0xffffffffffffffff) {
            if (uVar13 < uVar8) {
              ppcVar11 = &result_data[uVar13].value.pointer.ptr;
              do {
                sVar15 = StringCast::Operation<signed_char>(ldata[uVar12],(Vector *)dataptr);
                uVar6 = sVar15.value._0_8_;
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
                paVar1->length = (int)uVar6;
                paVar1->prefix[0] = (char)((ulong)uVar6 >> 0x20);
                paVar1->prefix[1] = (char)((ulong)uVar6 >> 0x28);
                paVar1->prefix[2] = (char)((ulong)uVar6 >> 0x30);
                paVar1->prefix[3] = (char)((ulong)uVar6 >> 0x38);
                *ppcVar11 = sVar15.value._8_8_;
                uVar12 = uVar12 + 1;
                ppcVar11 = ppcVar11 + 2;
              } while (uVar8 != uVar12);
            }
          }
          else if (uVar13 < uVar8) {
            ppcVar11 = &result_data[uVar13].value.pointer.ptr;
            uVar10 = 0;
            do {
              if ((uVar14 >> (uVar10 & 0x3f) & 1) != 0) {
                sVar15 = StringCast::Operation<signed_char>(ldata[uVar13],(Vector *)dataptr);
                uVar6 = sVar15.value._0_8_;
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
                paVar1->length = (int)uVar6;
                paVar1->prefix[0] = (char)((ulong)uVar6 >> 0x20);
                paVar1->prefix[1] = (char)((ulong)uVar6 >> 0x28);
                paVar1->prefix[2] = (char)((ulong)uVar6 >> 0x30);
                paVar1->prefix[3] = (char)((ulong)uVar6 >> 0x38);
                *ppcVar11 = sVar15.value._8_8_;
              }
              uVar13 = uVar13 + 1;
              ppcVar11 = ppcVar11 + 2;
              uVar10 = uVar10 + 1;
              uVar12 = uVar13;
            } while (uVar8 != uVar13);
          }
        }
        uVar9 = uVar9 + 1;
        uVar13 = uVar12;
      } while (uVar9 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}